

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

put_transaction<void> * __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
put_transaction<void>::operator=(put_transaction<void> *this,put_transaction<int> *i_source)

{
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar1;
  ControlBlock *pCVar2;
  void *pvVar3;
  void *pvVar4;
  Allocation __tmp;
  
  if ((put_transaction<int> *)this != i_source) {
    if (*(long *)this != 0) {
      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      put_transaction<void>::cancel((put_transaction<void> *)this);
    }
    phVar1 = *(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> **)
              this;
    *(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> **)this =
         i_source->m_queue;
    i_source->m_queue = phVar1;
    pCVar2 = *(ControlBlock **)(this + 8);
    pvVar3 = *(void **)(this + 0x10);
    pvVar4 = (i_source->m_put_data).m_user_storage;
    *(ControlBlock **)(this + 8) = (i_source->m_put_data).m_control_block;
    *(void **)(this + 0x10) = pvVar4;
    (i_source->m_put_data).m_control_block = pCVar2;
    (i_source->m_put_data).m_user_storage = pvVar3;
  }
  return (put_transaction<void> *)this;
}

Assistant:

put_transaction & operator=(put_transaction<OTHERTYPE> && i_source) noexcept
            {
                if (
                  this !=
                  static_cast<void *>(
                    &i_source)) // cast to void to allow comparing pointers to unrelated types
                {
                    if (!empty())
                        cancel();

                    std::swap(m_queue, i_source.m_queue);
                    std::swap(m_put_data, i_source.m_put_data);
                }
                return *this;
            }